

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckApplet(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  ctmbstr local_30;
  ctmbstr word;
  AttVal *av;
  Bool HasDescription;
  Bool HasAlt;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  bVar1 = false;
  bVar2 = false;
  BVar3 = Level1_Enabled(doc);
  if (BVar3 != no) {
    for (word = (ctmbstr)node->attributes; word != (ctmbstr)0x0; word = *(ctmbstr *)word) {
      if ((((word != (ctmbstr)0x0) && (*(long *)(word + 8) != 0)) && (**(int **)(word + 8) == 10))
         && (*(long *)(word + 0x30) != 0)) {
        bVar1 = true;
      }
    }
    if ((!bVar1) && (node->content != (Node *)0x0)) {
      local_30 = (ctmbstr)0x0;
      if (node->content->tag == (Dict *)0x0) {
        local_30 = textFromOneNode(doc,node->content);
      }
      if ((node->content->content != (Node *)0x0) && (node->content->content->tag == (Dict *)0x0)) {
        local_30 = textFromOneNode(doc,node->content->content);
      }
      if ((local_30 != (ctmbstr)0x0) && (BVar3 = IsWhitespace(local_30), BVar3 == no)) {
        bVar2 = true;
      }
    }
    if ((!bVar2) && (!bVar1)) {
      prvTidyReportAccessError(doc,node,0x29d);
    }
  }
  return;
}

Assistant:

static void CheckApplet( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool HasDescription = no;

    AttVal* av;
        
    if (Level1_Enabled( doc ))
    {
        /* Checks for attributes within the APPLET element */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /*
               Checks for valid ALT attribute.
               The length of the alt text must be > 4 characters in length
               but must be < 150 characters long.
            */

            if ( attrIsALT(av) )
            {
                if (av->value != NULL)
                {
                    HasAlt = yes;
                }
            }
        }

        if (HasAlt == no)
        {
            /* Must have alternate text representation for that element */
            if (node->content != NULL) 
            {
                ctmbstr word = NULL;

                if ( node->content->tag == NULL )
                    word = textFromOneNode( doc, node->content);

                if ( node->content->content != NULL &&
                     node->content->content->tag == NULL )
                {
                    word = textFromOneNode( doc, node->content->content);
                }
                
                if ( word != NULL && !IsWhitespace(word) )
                    HasDescription = yes;
            }
        }

        if ( !HasDescription && !HasAlt )
        {
            TY_(ReportAccessError)( doc, node, APPLET_MISSING_ALT );
        }
    }
}